

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::RobustnessRobustBufferAccessBehavior::GetnUniformTest::verifyResult
          (GetnUniformTest *this,void *inputData,void *resultData,int size,char *method)

{
  ostringstream *this_00;
  int iVar1;
  undefined1 local_198 [384];
  
  iVar1 = bcmp(inputData,resultData,(long)size);
  if (iVar1 != 0) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Test failed! ");
    std::operator<<((ostream *)this_00,method);
    std::operator<<((ostream *)this_00," result is not as expected.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return iVar1 == 0;
}

Assistant:

bool GetnUniformTest::verifyResult(const void* inputData, const void* resultData, int size, const char* method)
{
	int diff = memcmp(inputData, resultData, size);
	if (diff != 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! " << method << " result is not as expected."
						   << tcu::TestLog::EndMessage;

		return false;
	}

	return true;
}